

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

uint64_t mpidr_read_val(CPUARMState_conflict *env)

{
  ulong uVar1;
  int iVar2;
  ArchCPU_conflict2 *pAVar3;
  ulong local_20;
  uint64_t mpidr;
  ARMCPU_conflict1 *cpu;
  CPUARMState_conflict *env_local;
  
  pAVar3 = env_archcpu(env);
  uVar1 = pAVar3->mp_affinity;
  iVar2 = arm_feature(env,0xc);
  local_20 = uVar1;
  if ((iVar2 != 0) && (local_20 = uVar1 | 0x80000000, (pAVar3->mp_is_up & 1U) != 0)) {
    local_20 = uVar1 | 0xc0000000;
  }
  return local_20;
}

Assistant:

static uint64_t mpidr_read_val(CPUARMState *env)
{
    ARMCPU *cpu = env_archcpu(env);
    uint64_t mpidr = cpu->mp_affinity;

    if (arm_feature(env, ARM_FEATURE_V7MP)) {
        mpidr |= (1U << 31);
        /* Cores which are uniprocessor (non-coherent)
         * but still implement the MP extensions set
         * bit 30. (For instance, Cortex-R5).
         */
        if (cpu->mp_is_up) {
            mpidr |= (1u << 30);
        }
    }
    return mpidr;
}